

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

string * __thiscall
iutest::internal::
FormatForComparisonFailureMessage<std::tuple<int,int,int,int,int,int,int,int,int,int>,std::tuple<int,int,int,int,int,int,int,int,int,int>>
          (string *__return_storage_ptr__,internal *this,
          tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *value,
          tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *param_2)

{
  iu_global_format_stringstream strm;
  undefined1 auStack_198 [128];
  ios_base local_118 [264];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)auStack_198);
  detail::iuUniversalPrinter<std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int>_>::Print
            ((tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *)this,
             (iu_ostream *)(auStack_198 + 0x10));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)auStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}